

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmCommandContext *cc,cmExecutionStatus *status)

{
  int *piVar1;
  cmMakefile *pcVar2;
  string local_88;
  cmListFileContext local_68;
  
  this->Makefile = mf;
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_88,&mf->StateSnapshot);
  cmListFileContext::FromCommandContext(&local_68,cc,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  cmListFileBacktrace::Push
            ((cmListFileBacktrace *)&local_88,(cmListFileContext *)&this->Makefile->Backtrace);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &this->Makefile->Backtrace,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&local_88
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  pcVar2 = this->Makefile;
  piVar1 = &pcVar2->RecursionDepth;
  *piVar1 = *piVar1 + 1;
  local_88._M_dataplus._M_p = &status->ReturnInvoked;
  std::vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>>::
  emplace_back<cmExecutionStatus*>
            ((vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>> *)
             &pcVar2->ExecutionStatusStack,(cmExecutionStatus **)&local_88);
  cmListFileContext::~cmListFileContext(&local_68);
  return;
}

Assistant:

cmMakefileCall(cmMakefile* mf, cmCommandContext const& cc,
                 cmExecutionStatus& status)
    : Makefile(mf)
  {
    cmListFileContext const& lfc = cmListFileContext::FromCommandContext(
      cc, this->Makefile->StateSnapshot.GetExecutionListFile());
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(lfc);
    ++this->Makefile->RecursionDepth;
    this->Makefile->ExecutionStatusStack.push_back(&status);
  }